

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
* __thiscall
Graph<unsigned_long,_scc::VectorType>::dual_dfs
          (vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
           *__return_storage_ptr__,Graph<unsigned_long,_scc::VectorType> *this)

{
  pointer pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  bool *pbVar31;
  ulong uVar32;
  ulong uVar33;
  Node *i;
  pointer pNVar34;
  undefined1 auVar35 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar58;
  int iVar59;
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  int iVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar34 = (this->nodes).
            super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar34 != pNVar1) {
    do {
      Node::dual_dfs(pNVar34,__return_storage_ptr__);
      auVar30 = _DAT_00107090;
      auVar29 = _DAT_00107080;
      auVar28 = _DAT_00107070;
      auVar27 = _DAT_00107060;
      auVar26 = _DAT_00107050;
      auVar25 = _DAT_00107040;
      auVar24 = _DAT_00107030;
      pNVar34 = pNVar34 + 1;
    } while (pNVar34 != pNVar1);
    pNVar34 = (this->nodes).
              super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pNVar1 = (this->nodes).
             super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar34 != pNVar1) {
      uVar32 = (long)pNVar1 + (-0x40 - (long)pNVar34);
      auVar56._8_4_ = (int)uVar32;
      auVar56._0_8_ = uVar32;
      auVar56._12_4_ = (int)(uVar32 >> 0x20);
      auVar35._0_8_ = uVar32 >> 6;
      auVar35._8_8_ = auVar56._8_8_ >> 6;
      pbVar31 = &pNVar34[0xf].visited;
      uVar33 = 0;
      do {
        auVar53._8_4_ = (int)uVar33;
        auVar53._0_8_ = uVar33;
        auVar53._12_4_ = (int)(uVar33 >> 0x20);
        auVar56 = auVar35 ^ auVar30;
        auVar61 = (auVar53 | auVar29) ^ auVar30;
        iVar55 = auVar56._0_4_;
        iVar74 = -(uint)(iVar55 < auVar61._0_4_);
        iVar58 = auVar56._4_4_;
        auVar63._4_4_ = -(uint)(iVar58 < auVar61._4_4_);
        iVar59 = auVar56._8_4_;
        iVar78 = -(uint)(iVar59 < auVar61._8_4_);
        iVar60 = auVar56._12_4_;
        auVar63._12_4_ = -(uint)(iVar60 < auVar61._12_4_);
        auVar36._4_4_ = iVar74;
        auVar36._0_4_ = iVar74;
        auVar36._8_4_ = iVar78;
        auVar36._12_4_ = iVar78;
        auVar56 = pshuflw(in_XMM1,auVar36,0xe8);
        auVar62._4_4_ = -(uint)(auVar61._4_4_ == iVar58);
        auVar62._12_4_ = -(uint)(auVar61._12_4_ == iVar60);
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar45 = pshuflw(in_XMM2,auVar62,0xe8);
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar36 = pshuflw(auVar56,auVar63,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar36 | auVar45 & auVar56) ^ auVar61;
        auVar56 = packssdw(auVar61,auVar61);
        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar31[-0x3c0] = false;
        }
        auVar11._4_4_ = iVar74;
        auVar11._0_4_ = iVar74;
        auVar11._8_4_ = iVar78;
        auVar11._12_4_ = iVar78;
        auVar63 = auVar62 & auVar11 | auVar63;
        auVar56 = packssdw(auVar63,auVar63);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar45,auVar56 ^ auVar45);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._0_4_ >> 8 & 1) != 0) {
          pbVar31[-0x380] = false;
        }
        auVar56 = (auVar53 | auVar28) ^ auVar30;
        auVar46._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar46._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar46._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar46._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar64._4_4_ = auVar46._0_4_;
        auVar64._0_4_ = auVar46._0_4_;
        auVar64._8_4_ = auVar46._8_4_;
        auVar64._12_4_ = auVar46._8_4_;
        iVar74 = -(uint)(auVar56._4_4_ == iVar58);
        iVar78 = -(uint)(auVar56._12_4_ == iVar60);
        auVar12._4_4_ = iVar74;
        auVar12._0_4_ = iVar74;
        auVar12._8_4_ = iVar78;
        auVar12._12_4_ = iVar78;
        auVar75._4_4_ = auVar46._4_4_;
        auVar75._0_4_ = auVar46._4_4_;
        auVar75._8_4_ = auVar46._12_4_;
        auVar75._12_4_ = auVar46._12_4_;
        auVar56 = auVar12 & auVar64 | auVar75;
        auVar56 = packssdw(auVar56,auVar56);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar2,auVar56 ^ auVar2);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
          pbVar31[-0x340] = false;
        }
        auVar56 = pshufhw(auVar56,auVar64,0x84);
        auVar13._4_4_ = iVar74;
        auVar13._0_4_ = iVar74;
        auVar13._8_4_ = iVar78;
        auVar13._12_4_ = iVar78;
        auVar36 = pshufhw(auVar46,auVar13,0x84);
        auVar61 = pshufhw(auVar56,auVar75,0x84);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar37 = (auVar61 | auVar36 & auVar56) ^ auVar37;
        auVar56 = packssdw(auVar37,auVar37);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._0_4_ >> 0x18 & 1) != 0) {
          pbVar31[-0x300] = false;
        }
        auVar56 = (auVar53 | auVar27) ^ auVar30;
        auVar47._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar47._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar47._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar47._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar14._4_4_ = auVar47._0_4_;
        auVar14._0_4_ = auVar47._0_4_;
        auVar14._8_4_ = auVar47._8_4_;
        auVar14._12_4_ = auVar47._8_4_;
        auVar36 = pshuflw(auVar75,auVar14,0xe8);
        auVar38._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
        auVar38._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
        auVar38._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
        auVar38._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
        auVar65._4_4_ = auVar38._4_4_;
        auVar65._0_4_ = auVar38._4_4_;
        auVar65._8_4_ = auVar38._12_4_;
        auVar65._12_4_ = auVar38._12_4_;
        auVar56 = pshuflw(auVar38,auVar65,0xe8);
        auVar66._4_4_ = auVar47._4_4_;
        auVar66._0_4_ = auVar47._4_4_;
        auVar66._8_4_ = auVar47._12_4_;
        auVar66._12_4_ = auVar47._12_4_;
        auVar61 = pshuflw(auVar47,auVar66,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 & auVar36,(auVar61 | auVar56 & auVar36) ^ auVar3);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar31[-0x2c0] = false;
        }
        auVar15._4_4_ = auVar47._0_4_;
        auVar15._0_4_ = auVar47._0_4_;
        auVar15._8_4_ = auVar47._8_4_;
        auVar15._12_4_ = auVar47._8_4_;
        auVar66 = auVar65 & auVar15 | auVar66;
        auVar61 = packssdw(auVar66,auVar66);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56,auVar61 ^ auVar4);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._4_2_ >> 8 & 1) != 0) {
          pbVar31[-0x280] = false;
        }
        auVar56 = (auVar53 | auVar26) ^ auVar30;
        auVar48._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar48._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar48._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar48._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar67._4_4_ = auVar48._0_4_;
        auVar67._0_4_ = auVar48._0_4_;
        auVar67._8_4_ = auVar48._8_4_;
        auVar67._12_4_ = auVar48._8_4_;
        iVar74 = -(uint)(auVar56._4_4_ == iVar58);
        iVar78 = -(uint)(auVar56._12_4_ == iVar60);
        auVar16._4_4_ = iVar74;
        auVar16._0_4_ = iVar74;
        auVar16._8_4_ = iVar78;
        auVar16._12_4_ = iVar78;
        auVar76._4_4_ = auVar48._4_4_;
        auVar76._0_4_ = auVar48._4_4_;
        auVar76._8_4_ = auVar48._12_4_;
        auVar76._12_4_ = auVar48._12_4_;
        auVar56 = auVar16 & auVar67 | auVar76;
        auVar56 = packssdw(auVar56,auVar56);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar5,auVar56 ^ auVar5);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar31[-0x240] = false;
        }
        auVar56 = pshufhw(auVar56,auVar67,0x84);
        auVar17._4_4_ = iVar74;
        auVar17._0_4_ = iVar74;
        auVar17._8_4_ = iVar78;
        auVar17._12_4_ = iVar78;
        auVar36 = pshufhw(auVar48,auVar17,0x84);
        auVar61 = pshufhw(auVar56,auVar76,0x84);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar39 = (auVar61 | auVar36 & auVar56) ^ auVar39;
        auVar56 = packssdw(auVar39,auVar39);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._6_2_ >> 8 & 1) != 0) {
          pbVar31[-0x200] = false;
        }
        auVar56 = (auVar53 | auVar25) ^ auVar30;
        auVar49._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar49._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar49._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar49._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar18._4_4_ = auVar49._0_4_;
        auVar18._0_4_ = auVar49._0_4_;
        auVar18._8_4_ = auVar49._8_4_;
        auVar18._12_4_ = auVar49._8_4_;
        auVar36 = pshuflw(auVar76,auVar18,0xe8);
        auVar40._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
        auVar40._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
        auVar40._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
        auVar40._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
        auVar68._4_4_ = auVar40._4_4_;
        auVar68._0_4_ = auVar40._4_4_;
        auVar68._8_4_ = auVar40._12_4_;
        auVar68._12_4_ = auVar40._12_4_;
        auVar56 = pshuflw(auVar40,auVar68,0xe8);
        auVar69._4_4_ = auVar49._4_4_;
        auVar69._0_4_ = auVar49._4_4_;
        auVar69._8_4_ = auVar49._12_4_;
        auVar69._12_4_ = auVar49._12_4_;
        auVar61 = pshuflw(auVar49,auVar69,0xe8);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar61 | auVar56 & auVar36) ^ auVar50;
        auVar61 = packssdw(auVar50,auVar50);
        auVar56 = packsswb(auVar56 & auVar36,auVar61);
        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar31[-0x1c0] = false;
        }
        auVar19._4_4_ = auVar49._0_4_;
        auVar19._0_4_ = auVar49._0_4_;
        auVar19._8_4_ = auVar49._8_4_;
        auVar19._12_4_ = auVar49._8_4_;
        auVar69 = auVar68 & auVar19 | auVar69;
        auVar61 = packssdw(auVar69,auVar69);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar61 = packssdw(auVar61 ^ auVar6,auVar61 ^ auVar6);
        auVar56 = packsswb(auVar56,auVar61);
        if ((auVar56._8_2_ >> 8 & 1) != 0) {
          pbVar31[-0x180] = false;
        }
        auVar56 = (auVar53 | auVar24) ^ auVar30;
        auVar51._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar51._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar51._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar51._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar70._4_4_ = auVar51._0_4_;
        auVar70._0_4_ = auVar51._0_4_;
        auVar70._8_4_ = auVar51._8_4_;
        auVar70._12_4_ = auVar51._8_4_;
        iVar74 = -(uint)(auVar56._4_4_ == iVar58);
        iVar78 = -(uint)(auVar56._12_4_ == iVar60);
        auVar20._4_4_ = iVar74;
        auVar20._0_4_ = iVar74;
        auVar20._8_4_ = iVar78;
        auVar20._12_4_ = iVar78;
        auVar77._4_4_ = auVar51._4_4_;
        auVar77._0_4_ = auVar51._4_4_;
        auVar77._8_4_ = auVar51._12_4_;
        auVar77._12_4_ = auVar51._12_4_;
        auVar56 = auVar20 & auVar70 | auVar77;
        auVar56 = packssdw(auVar56,auVar56);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar7,auVar56 ^ auVar7);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar31[-0x140] = false;
        }
        auVar56 = pshufhw(auVar56,auVar70,0x84);
        auVar21._4_4_ = iVar74;
        auVar21._0_4_ = iVar74;
        auVar21._8_4_ = iVar78;
        auVar21._12_4_ = iVar78;
        auVar36 = pshufhw(auVar51,auVar21,0x84);
        auVar61 = pshufhw(auVar56,auVar77,0x84);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar41 = (auVar61 | auVar36 & auVar56) ^ auVar41;
        auVar56 = packssdw(auVar41,auVar41);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._10_2_ >> 8 & 1) != 0) {
          pbVar31[-0x100] = false;
        }
        auVar56 = (auVar53 | _DAT_00107020) ^ auVar30;
        auVar52._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar52._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar52._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar52._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar22._4_4_ = auVar52._0_4_;
        auVar22._0_4_ = auVar52._0_4_;
        auVar22._8_4_ = auVar52._8_4_;
        auVar22._12_4_ = auVar52._8_4_;
        auVar36 = pshuflw(auVar77,auVar22,0xe8);
        auVar42._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
        auVar42._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
        auVar42._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
        auVar42._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
        auVar71._4_4_ = auVar42._4_4_;
        auVar71._0_4_ = auVar42._4_4_;
        auVar71._8_4_ = auVar42._12_4_;
        auVar71._12_4_ = auVar42._12_4_;
        auVar56 = pshuflw(auVar42,auVar71,0xe8);
        auVar72._4_4_ = auVar52._4_4_;
        auVar72._0_4_ = auVar52._4_4_;
        auVar72._8_4_ = auVar52._12_4_;
        auVar72._12_4_ = auVar52._12_4_;
        auVar61 = pshuflw(auVar52,auVar72,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 & auVar36,(auVar61 | auVar56 & auVar36) ^ auVar8);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar31[-0xc0] = false;
        }
        auVar23._4_4_ = auVar52._0_4_;
        auVar23._0_4_ = auVar52._0_4_;
        auVar23._8_4_ = auVar52._8_4_;
        auVar23._12_4_ = auVar52._8_4_;
        auVar72 = auVar71 & auVar23 | auVar72;
        auVar61 = packssdw(auVar72,auVar72);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56,auVar61 ^ auVar9);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56._12_2_ >> 8 & 1) != 0) {
          pbVar31[-0x80] = false;
        }
        auVar56 = (auVar53 | _DAT_00107010) ^ auVar30;
        auVar43._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
        auVar43._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
        auVar43._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
        auVar43._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
        auVar73._4_4_ = auVar43._0_4_;
        auVar73._0_4_ = auVar43._0_4_;
        auVar73._8_4_ = auVar43._8_4_;
        auVar73._12_4_ = auVar43._8_4_;
        auVar54._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
        auVar54._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar57._4_4_ = auVar43._4_4_;
        auVar57._0_4_ = auVar43._4_4_;
        auVar57._8_4_ = auVar43._12_4_;
        auVar57._12_4_ = auVar43._12_4_;
        auVar61 = auVar54 & auVar73 | auVar57;
        auVar56 = packssdw(auVar43,auVar61);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar56 = packssdw(auVar56 ^ auVar10,auVar56 ^ auVar10);
        auVar56 = packsswb(auVar56,auVar56);
        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar31[-0x40] = false;
        }
        auVar56 = pshufhw(auVar56,auVar73,0x84);
        in_XMM2 = pshufhw(auVar61,auVar54,0x84);
        in_XMM2 = in_XMM2 & auVar56;
        auVar56 = pshufhw(auVar56,auVar57,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar56 | in_XMM2) ^ auVar44;
        auVar56 = packssdw(auVar44,auVar44);
        in_XMM1 = packsswb(auVar56,auVar56);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          *pbVar31 = false;
        }
        uVar33 = uVar33 + 0x10;
        pbVar31 = pbVar31 + 0x400;
      } while (((uVar32 >> 6) + 0x10 & 0xfffffffffffffff0) != uVar33);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Node *> dual_dfs() {
        std::vector<const Node *> ordered_nodes{};
        for (auto &i: nodes) {
            TypeImpl::get(i).dual_dfs(ordered_nodes);
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return ordered_nodes;
    }